

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  string *__lhs;
  FieldDescriptor FVar1;
  Finder *pFVar2;
  OneofDescriptor *oneof_descriptor;
  bool bVar3;
  __type _Var4;
  bool bVar5;
  int iVar6;
  Type TVar7;
  CppType CVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  FieldDescriptor *this_00;
  Descriptor *pDVar9;
  Descriptor *pDVar10;
  LogMessage *other;
  FieldDescriptor *pFVar11;
  MessageFactory *factory;
  MessageLite *this_01;
  AlphaNum *pAVar12;
  Reflection *this_02;
  ParseLocationRange range;
  string serialized_value;
  AlphaNum local_158;
  string prefix;
  string full_type_name;
  string field_name;
  string prefix_and_full_type_name;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  undefined1 local_98 [40];
  string local_70;
  string local_50;
  undefined4 extraout_var_03;
  
  pAVar12 = (AlphaNum *)&serialized_value;
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  iVar6 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  pDVar9 = (Descriptor *)CONCAT44(extraout_var,iVar6);
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  local_98._32_4_ = (this->tokenizer_).current_.line;
  local_98._36_4_ = (this->tokenizer_).current_.column;
  bVar3 = internal::GetAnyFieldDescriptors(message,&any_type_url_field,&any_value_field);
  if (bVar3) {
    std::__cxx11::string::string((string *)&serialized_value,"[",(allocator *)&local_158);
    bVar3 = TryConsume(this,&serialized_value);
    std::__cxx11::string::~string((string *)&serialized_value);
    if (bVar3) {
      full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
      full_type_name._M_string_length = 0;
      pAVar12 = (AlphaNum *)0x0;
      full_type_name.field_2._M_local_buf[0] = '\0';
      prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
      prefix._M_string_length = 0;
      prefix.field_2._M_local_buf[0] = '\0';
      bVar3 = ConsumeAnyTypeUrl(this,&full_type_name,&prefix);
      if (bVar3) {
        serialized_value._M_dataplus = prefix._M_dataplus;
        serialized_value._M_string_length = prefix._M_string_length;
        local_158.piece_data_ = full_type_name._M_dataplus._M_p;
        local_158.piece_size_ = full_type_name._M_string_length;
        StrCat_abi_cxx11_(&prefix_and_full_type_name,(protobuf *)&serialized_value,&local_158,
                          pAVar12);
        std::__cxx11::string::string((string *)&serialized_value,"]",(allocator *)&local_158);
        bVar3 = ConsumeBeforeWhitespace(this,&serialized_value);
        std::__cxx11::string::~string((string *)&serialized_value);
        if (bVar3) {
          TryConsumeWhitespace(this,&prefix_and_full_type_name,"Any");
          std::__cxx11::string::string((string *)&serialized_value,":",(allocator *)&local_158);
          TryConsumeBeforeWhitespace(this,&serialized_value);
          std::__cxx11::string::~string((string *)&serialized_value);
          TryConsumeWhitespace(this,&prefix_and_full_type_name,"Any");
          serialized_value._M_dataplus._M_p = (pointer)&serialized_value.field_2;
          serialized_value._M_string_length = 0;
          serialized_value.field_2._M_local_buf[0] = '\0';
          pFVar2 = this->finder_;
          if (pFVar2 == (Finder *)0x0) {
            pDVar9 = anon_unknown_19::DefaultFinderFindAnyType(message,&prefix,&full_type_name);
          }
          else {
            iVar6 = (*pFVar2->_vptr_Finder[4])(pFVar2,message,&prefix,&full_type_name);
            pDVar9 = (Descriptor *)CONCAT44(extraout_var_00,iVar6);
          }
          if (pDVar9 == (Descriptor *)0x0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"Could not find type \"",&prefix_and_full_type_name);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_158,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"\" stored in google.protobuf.Any.");
            ReportError(this,(string *)&local_158);
            std::__cxx11::string::~string((string *)&local_158);
            pAVar12 = (AlphaNum *)local_98;
LAB_003af9e3:
            std::__cxx11::string::~string((string *)pAVar12);
LAB_003af9e8:
            bVar3 = false;
          }
          else {
            bVar3 = ConsumeAnyValue(this,pDVar9,&serialized_value);
            if (!bVar3) goto LAB_003af9e8;
            if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
               ((((~(byte)any_type_url_field[1] & 0x60) != 0 &&
                 (bVar3 = Reflection::HasField(this_02,message,any_type_url_field), bVar3)) ||
                (((~(byte)any_value_field[1] & 0x60) != 0 &&
                 (bVar3 = Reflection::HasField(this_02,message,any_value_field), bVar3)))))) {
              std::__cxx11::string::string
                        ((string *)&local_158,"Non-repeated Any specified multiple times.",
                         (allocator *)local_98);
              ReportError(this,(string *)&local_158);
              pAVar12 = &local_158;
              goto LAB_003af9e3;
            }
            std::__cxx11::string::string((string *)&local_50,(string *)&prefix_and_full_type_name);
            Reflection::SetString(this_02,message,any_type_url_field,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::string((string *)&local_70,(string *)&serialized_value);
            Reflection::SetString(this_02,message,any_value_field,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            bVar3 = true;
          }
          std::__cxx11::string::~string((string *)&serialized_value);
        }
        else {
          bVar3 = false;
        }
        std::__cxx11::string::~string((string *)&prefix_and_full_type_name);
      }
      else {
        bVar3 = false;
      }
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&full_type_name);
      goto LAB_003b026f;
    }
  }
  std::__cxx11::string::string((string *)&serialized_value,"[",(allocator *)&local_158);
  bVar3 = TryConsume(this,&serialized_value);
  std::__cxx11::string::~string((string *)&serialized_value);
  if (bVar3) {
    bVar3 = ConsumeFullTypeName(this,&field_name);
    if (bVar3) {
      std::__cxx11::string::string((string *)&serialized_value,"]",(allocator *)&local_158);
      bVar3 = ConsumeBeforeWhitespace(this,&serialized_value);
      std::__cxx11::string::~string((string *)&serialized_value);
      if (bVar3) {
        (*(message->super_MessageLite)._vptr_MessageLite[2])(&serialized_value,message);
        TryConsumeWhitespace(this,&serialized_value,"Extension");
        std::__cxx11::string::~string((string *)&serialized_value);
        pFVar2 = this->finder_;
        if (pFVar2 == (Finder *)0x0) {
          pFVar11 = anon_unknown_19::DefaultFinderFindExtension(message,&field_name);
        }
        else {
          iVar6 = (*pFVar2->_vptr_Finder[2])(pFVar2,message,&field_name);
          pFVar11 = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar6);
        }
        if (pFVar11 != (FieldDescriptor *)0x0) goto LAB_003afb5c;
        if ((this->allow_unknown_field_ == false) && (this->allow_unknown_extension_ == false)) {
          std::operator+(&prefix,"Extension \"",&field_name);
          std::operator+(&full_type_name,&prefix,"\" is not defined or is not an extension of \"");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_158,&full_type_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(pDVar9 + 8) + 0x20));
          std::operator+(&serialized_value,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_158,"\".");
          ReportError(this,&serialized_value);
          goto LAB_003b0244;
        }
        std::operator+(&prefix,"Ignoring extension \"",&field_name);
        std::operator+(&full_type_name,&prefix,
                       "\" which is not defined or is not an extension of \"");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_158,&full_type_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(pDVar9 + 8) + 0x20));
        std::operator+(&serialized_value,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_158,"\".");
        ReportWarning(this,&serialized_value);
LAB_003afc54:
        std::__cxx11::string::~string((string *)&serialized_value);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&full_type_name);
        std::__cxx11::string::~string((string *)&prefix);
        bVar3 = false;
LAB_003afc7f:
        if (((this->allow_unknown_field_ == false) && (!bVar3)) &&
           ((this->allow_unknown_extension_ & 1U) == 0)) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&serialized_value,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                     ,0x221);
          other = internal::LogMessage::operator<<
                            ((LogMessage *)&serialized_value,
                             "CHECK failed: allow_unknown_field_ || allow_unknown_extension_ || reserved_field: "
                            );
          internal::LogFinisher::operator=((LogFinisher *)&local_158,other);
          internal::LogMessage::~LogMessage((LogMessage *)&serialized_value);
        }
        std::__cxx11::string::string((string *)&serialized_value,":",(allocator *)&local_158);
        bVar3 = TryConsumeBeforeWhitespace(this,&serialized_value);
        std::__cxx11::string::~string((string *)&serialized_value);
        if (bVar3) {
          (*(message->super_MessageLite)._vptr_MessageLite[2])(&serialized_value,message);
          TryConsumeWhitespace(this,&serialized_value,"Unknown/Reserved");
          std::__cxx11::string::~string((string *)&serialized_value);
          std::__cxx11::string::string((string *)&serialized_value,"{",(allocator *)&full_type_name)
          ;
          __lhs = &(this->tokenizer_).current_.text;
          _Var4 = std::operator==(__lhs,&serialized_value);
          if (_Var4) {
            std::__cxx11::string::~string((string *)&serialized_value);
          }
          else {
            std::__cxx11::string::string((string *)&local_158,"<",(allocator *)&prefix);
            _Var4 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&local_158);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&serialized_value);
            if (!_Var4) {
              bVar3 = SkipFieldValue(this);
              goto LAB_003b026f;
            }
          }
        }
        bVar3 = SkipFieldMessage(this);
        goto LAB_003b026f;
      }
    }
LAB_003b026d:
    bVar3 = false;
  }
  else {
    bVar3 = ConsumeIdentifierBeforeWhitespace(this,&field_name);
    if (!bVar3) goto LAB_003b026d;
    (*(message->super_MessageLite)._vptr_MessageLite[2])(&serialized_value,message);
    TryConsumeWhitespace(this,&serialized_value,"Normal");
    std::__cxx11::string::~string((string *)&serialized_value);
    if ((this->allow_field_number_ == true) &&
       (bVar3 = safe_strto32(&field_name,(int32 *)&prefix_and_full_type_name), bVar3)) {
      bVar3 = Descriptor::IsExtensionNumber(pDVar9,(int)prefix_and_full_type_name._M_dataplus._M_p);
      if (!bVar3) {
        bVar5 = Descriptor::IsReservedNumber(pDVar9,(int)prefix_and_full_type_name._M_dataplus._M_p)
        ;
        bVar3 = true;
        if (!bVar5) {
          pFVar11 = Descriptor::FindFieldByNumber
                              (pDVar9,(int)prefix_and_full_type_name._M_dataplus._M_p);
          goto LAB_003afb50;
        }
        goto LAB_003afc7f;
      }
      pFVar2 = this->finder_;
      if (pFVar2 == (Finder *)0x0) {
        pFVar11 = anon_unknown_19::DefaultFinderFindExtensionByNumber
                            (pDVar9,(int)prefix_and_full_type_name._M_dataplus._M_p);
      }
      else {
        iVar6 = (*pFVar2->_vptr_Finder[3])(pFVar2,pDVar9);
        pFVar11 = (FieldDescriptor *)CONCAT44(extraout_var_02,iVar6);
      }
LAB_003afb50:
      if (pFVar11 != (FieldDescriptor *)0x0) goto LAB_003afb5c;
LAB_003afbdc:
      if (this->allow_unknown_field_ != false) {
        std::operator+(&prefix,"Message type \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(pDVar9 + 8) + 0x20));
        std::operator+(&full_type_name,&prefix,"\" has no field named \"");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_158,&full_type_name,&field_name);
        std::operator+(&serialized_value,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_158,"\".");
        ReportWarning(this,&serialized_value);
        goto LAB_003afc54;
      }
      std::operator+(&prefix,"Message type \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)(pDVar9 + 8) + 0x20));
      std::operator+(&full_type_name,&prefix,"\" has no field named \"");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158
                     ,&full_type_name,&field_name);
      std::operator+(&serialized_value,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158
                     ,"\".");
      ReportError(this,&serialized_value);
LAB_003b0244:
      std::__cxx11::string::~string((string *)&serialized_value);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&full_type_name);
      pAVar12 = (AlphaNum *)&prefix;
LAB_003b0268:
      std::__cxx11::string::~string((string *)pAVar12);
      goto LAB_003b026d;
    }
    pFVar11 = Descriptor::FindFieldByName(pDVar9,&field_name);
    if (pFVar11 == (FieldDescriptor *)0x0) {
      std::__cxx11::string::string((string *)&serialized_value,(string *)&field_name);
      LowerString(&serialized_value);
      this_00 = Descriptor::FindFieldByName(pDVar9,&serialized_value);
      if (this_00 == (FieldDescriptor *)0x0) {
        pFVar11 = (FieldDescriptor *)0x0;
      }
      else {
        TVar7 = FieldDescriptor::type(this_00);
        pFVar11 = (FieldDescriptor *)0x0;
        if (TVar7 == TYPE_GROUP) {
          pFVar11 = this_00;
        }
      }
      std::__cxx11::string::~string((string *)&serialized_value);
      if (pFVar11 != (FieldDescriptor *)0x0) goto LAB_003af9ff;
LAB_003afa31:
      if (this->allow_case_insensitive_field_ == true) {
        std::__cxx11::string::string((string *)&serialized_value,(string *)&field_name);
        LowerString(&serialized_value);
        pFVar11 = Descriptor::FindFieldByLowercaseName(pDVar9,&serialized_value);
        std::__cxx11::string::~string((string *)&serialized_value);
        if (pFVar11 != (FieldDescriptor *)0x0) goto LAB_003afb5c;
      }
      bVar5 = Descriptor::IsReservedName(pDVar9,&field_name);
      bVar3 = true;
      if (bVar5) goto LAB_003afc7f;
      goto LAB_003afbdc;
    }
LAB_003af9ff:
    TVar7 = FieldDescriptor::type(pFVar11);
    if (TVar7 == TYPE_GROUP) {
      pDVar10 = FieldDescriptor::message_type(pFVar11);
      bVar3 = std::operator!=(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **
                               )(pDVar10 + 8),&field_name);
      if (bVar3) goto LAB_003afa31;
    }
LAB_003afb5c:
    if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      FVar1 = pFVar11[1];
      if ((~(byte)FVar1 & 0x60) != 0) {
        bVar3 = Reflection::HasField(this_02,message,pFVar11);
        if (bVar3) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_158,"Non-repeated field \"",&field_name);
          std::operator+(&serialized_value,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_158,"\" is specified multiple times.");
          ReportError(this,&serialized_value);
          std::__cxx11::string::~string((string *)&serialized_value);
          pAVar12 = &local_158;
          goto LAB_003b0268;
        }
        FVar1 = pFVar11[1];
      }
      oneof_descriptor = *(OneofDescriptor **)(pFVar11 + 0x28);
      if ((oneof_descriptor != (OneofDescriptor *)0x0 && ((byte)FVar1 & 0x10) != 0) &&
         (bVar3 = Reflection::HasOneof(this_02,message,oneof_descriptor), bVar3)) {
        pFVar11 = Reflection::GetOneofFieldDescriptor(this_02,message,oneof_descriptor);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,"Field \"",&field_name);
        std::operator+(&prefix_and_full_type_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,"\" is specified along with field \"");
        std::operator+(&prefix,&prefix_and_full_type_name,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pFVar11 + 8));
        std::operator+(&full_type_name,&prefix,"\", another member of oneof \"");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_158,&full_type_name,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (oneof_descriptor + 8));
        std::operator+(&serialized_value,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_158,"\".");
        ReportError(this,&serialized_value);
        std::__cxx11::string::~string((string *)&serialized_value);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&full_type_name);
        std::__cxx11::string::~string((string *)&prefix);
        std::__cxx11::string::~string((string *)&prefix_and_full_type_name);
        pAVar12 = (AlphaNum *)local_98;
        goto LAB_003b0268;
      }
    }
    CVar8 = FieldDescriptor::cpp_type(pFVar11);
    if (CVar8 == CPPTYPE_MESSAGE) {
      std::__cxx11::string::string((string *)&serialized_value,":",(allocator *)&local_158);
      bVar3 = TryConsumeBeforeWhitespace(this,&serialized_value);
      std::__cxx11::string::~string((string *)&serialized_value);
      (*(message->super_MessageLite)._vptr_MessageLite[2])(&serialized_value,message);
      TryConsumeWhitespace(this,&serialized_value,"Normal");
      std::__cxx11::string::~string((string *)&serialized_value);
      if (((!bVar3) || (*(char *)(*(long *)(pFVar11 + 0x38) + 0x4f) != '\x01')) ||
         ((this->tokenizer_).current_.type != TYPE_STRING)) goto LAB_003affa4;
      serialized_value._M_dataplus._M_p = (pointer)&serialized_value.field_2;
      serialized_value._M_string_length = 0;
      serialized_value.field_2._M_local_buf[0] = '\0';
      bVar3 = ConsumeString(this,&serialized_value);
      if (!bVar3) goto LAB_003b0268;
      pFVar2 = this->finder_;
      if (pFVar2 == (Finder *)0x0) {
        factory = (MessageFactory *)0x0;
      }
      else {
        iVar6 = (*pFVar2->_vptr_Finder[5])(pFVar2,pFVar11);
        factory = (MessageFactory *)CONCAT44(extraout_var_03,iVar6);
      }
      this_01 = &Reflection::MutableMessage(this_02,message,pFVar11,factory)->super_MessageLite;
      MessageLite::ParseFromString(this_01,&serialized_value);
      std::__cxx11::string::~string((string *)&serialized_value);
    }
    else {
      std::__cxx11::string::string((string *)&serialized_value,":",(allocator *)&local_158);
      bVar3 = ConsumeBeforeWhitespace(this,&serialized_value);
      std::__cxx11::string::~string((string *)&serialized_value);
      if (!bVar3) goto LAB_003b026d;
      (*(message->super_MessageLite)._vptr_MessageLite[2])(&serialized_value,message);
      TryConsumeWhitespace(this,&serialized_value,"Normal");
      std::__cxx11::string::~string((string *)&serialized_value);
LAB_003affa4:
      if ((~(byte)pFVar11[1] & 0x60) == 0) {
        std::__cxx11::string::string((string *)&serialized_value,"[",(allocator *)&local_158);
        bVar3 = TryConsume(this,&serialized_value);
        std::__cxx11::string::~string((string *)&serialized_value);
        if (bVar3) {
          std::__cxx11::string::string((string *)&serialized_value,"]",(allocator *)&local_158);
          bVar3 = TryConsume(this,&serialized_value);
          std::__cxx11::string::~string((string *)&serialized_value);
          if (!bVar3) {
            do {
              CVar8 = FieldDescriptor::cpp_type(pFVar11);
              if (CVar8 == CPPTYPE_MESSAGE) {
                bVar3 = ConsumeFieldMessage(this,message,this_02,pFVar11);
              }
              else {
                bVar3 = ConsumeFieldValue(this,message,this_02,pFVar11);
              }
              if (bVar3 == false) goto LAB_003b026d;
              std::__cxx11::string::string((string *)&serialized_value,"]",(allocator *)&local_158);
              bVar3 = TryConsume(this,&serialized_value);
              std::__cxx11::string::~string((string *)&serialized_value);
              if (bVar3) goto LAB_003b02b5;
              std::__cxx11::string::string((string *)&serialized_value,",",(allocator *)&local_158);
              bVar5 = Consume(this,&serialized_value);
              std::__cxx11::string::~string((string *)&serialized_value);
              bVar3 = false;
            } while (bVar5);
            goto LAB_003b026f;
          }
          goto LAB_003b02b5;
        }
      }
      CVar8 = FieldDescriptor::cpp_type(pFVar11);
      if (CVar8 == CPPTYPE_MESSAGE) {
        bVar3 = ConsumeFieldMessage(this,message,this_02,pFVar11);
      }
      else {
        bVar3 = ConsumeFieldValue(this,message,this_02,pFVar11);
      }
      if (bVar3 == false) goto LAB_003b026d;
    }
LAB_003b02b5:
    std::__cxx11::string::string((string *)&serialized_value,";",(allocator *)&full_type_name);
    bVar3 = TryConsume(this,&serialized_value);
    if (!bVar3) {
      std::__cxx11::string::string((string *)&local_158,",",(allocator *)&prefix);
      TryConsume(this,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
    }
    std::__cxx11::string::~string((string *)&serialized_value);
    if (*(char *)(*(long *)(pFVar11 + 0x38) + 0x4e) == '\x01') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158
                     ,"text format contains deprecated field \"",&field_name);
      std::operator+(&serialized_value,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158
                     ,"\"");
      ReportWarning(this,&serialized_value);
      std::__cxx11::string::~string((string *)&serialized_value);
      std::__cxx11::string::~string((string *)&local_158);
    }
    bVar3 = true;
    if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
      range.end.column = (this->tokenizer_).previous_.end_column;
      range.end.line = (this->tokenizer_).previous_.line;
      range.start.line = local_98._32_4_;
      range.start.column = local_98._36_4_;
      ParseInfoTree::RecordLocation(this->parse_info_tree_,pFVar11,range);
    }
  }
LAB_003b026f:
  std::__cxx11::string::~string((string *)&field_name);
  return bVar3;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      std::string prefix_and_full_type_name =
          StrCat(prefix, full_type_name);
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace(prefix_and_full_type_name, "Any");
      // ':' is optional between message labels and values.
      TryConsumeBeforeWhitespace(":");
      TryConsumeWhitespace(prefix_and_full_type_name, "Any");
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError("Could not find type \"" + prefix_and_full_type_name +
                    "\" stored in google.protobuf.Any.");
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            prefix_and_full_type_name);
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace(message->GetTypeName(), "Extension");

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError("Extension \"" + field_name +
                      "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Ignoring extension \"" + field_name +
                        "\" which is not defined or is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
      TryConsumeWhitespace(message->GetTypeName(), "Normal");

      int32_t field_number;
      if (allow_field_number_ && safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr &&
              field->type() != FieldDescriptor::TYPE_GROUP) {
            field = nullptr;
          }
        }
        // Again, special-case group names as described above.
        if (field != nullptr && field->type() == FieldDescriptor::TYPE_GROUP &&
            field->message_type()->name() != field_name) {
          field = nullptr;
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }

      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      GOOGLE_CHECK(allow_unknown_field_ || allow_unknown_extension_ || reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace(message->GetTypeName(), "Unknown/Reserved");
        if (!LookingAt("{") && !LookingAt("<")) {
          return SkipFieldValue();
        }
      }
      return SkipFieldMessage();
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name +
                    "\" is specified along with "
                    "field \"" +
                    other_field->name() +
                    "\", another member "
                    "of oneof \"" +
                    oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsumeBeforeWhitespace(":");
      TryConsumeWhitespace(message->GetTypeName(), "Normal");
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(ConsumeBeforeWhitespace(":"));
      TryConsumeWhitespace(message->GetTypeName(), "Normal");
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \"" + field_name +
                    "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      int end_line = tokenizer_.previous().line;
      int end_column = tokenizer_.previous().end_column;

      RecordLocation(parse_info_tree_, field,
                     ParseLocationRange(ParseLocation(start_line, start_column),
                                        ParseLocation(end_line, end_column)));
    }

    return true;
  }